

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplaceRealloc<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,pointer pos,TokenKind *args)

{
  ulong uVar1;
  size_type sVar2;
  pointer __dest;
  pointer pTVar3;
  ulong uVar4;
  EVP_PKEY_CTX *ctx;
  long lVar5;
  
  if (this->len != 0x3fffffffffffffff) {
    uVar4 = this->len + 1;
    uVar1 = this->cap;
    if (uVar4 < uVar1 * 2) {
      uVar4 = uVar1 * 2;
    }
    if (0x3fffffffffffffff - uVar1 < uVar1) {
      uVar4 = 0x3fffffffffffffff;
    }
    lVar5 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(uVar4 * 2);
    pTVar3 = (pointer)((long)__dest + lVar5);
    *(TokenKind *)((long)__dest + lVar5) = *args;
    ctx = (EVP_PKEY_CTX *)this->data_;
    sVar2 = this->len;
    if (ctx + (sVar2 * 2 - (long)pos) == (EVP_PKEY_CTX *)0x0) {
      if (sVar2 != 0) {
        memmove(__dest,ctx,sVar2 * 2);
      }
    }
    else {
      if (ctx != (EVP_PKEY_CTX *)pos) {
        memmove(__dest,ctx,(long)pos - (long)ctx);
      }
      memcpy(pTVar3 + 1,pos,(size_t)(ctx + (sVar2 * 2 - (long)pos)));
      ctx = (EVP_PKEY_CTX *)pos;
    }
    cleanup(this,ctx);
    this->len = this->len + 1;
    this->cap = uVar4;
    this->data_ = __dest;
    return pTVar3;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}